

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funnelsort.cpp
# Opt level: O0

void __thiscall
fill<128U,_26U,_buffer_layout_dfs>::operator()
          (fill<128U,_26U,_buffer_layout_dfs> *this,array<Stream,_128UL> *streams,uchar **buffer,
          array<unsigned_long,_128UL> *buffer_count)

{
  long lVar1;
  size_t from0;
  int iVar2;
  ostream *poVar3;
  reference pvVar4;
  value_type vVar5;
  array<unsigned_long,_128UL> *buffer_count_local;
  uchar **buffer_local;
  array<Stream,_128UL> *streams_local;
  fill<128U,_26U,_buffer_layout_dfs> *this_local;
  uchar **resultbuf_2;
  uchar **l_1;
  size_t lcount_1;
  uchar **newbegin_1;
  uchar **begin_1;
  uchar **local_b8;
  uchar **resultbuf_1;
  uchar **r_1;
  size_t rcount_1;
  uchar **newbegin;
  uchar **begin;
  uchar **local_88;
  uchar **resultbuf;
  uchar **r;
  uchar **l;
  size_t rcount;
  size_t lcount;
  fill<128U,_52U,_buffer_layout_dfs> local_49;
  long local_48;
  size_t need;
  DI __d;
  
  __d.i = (string *)buffer_count;
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"fill_inner");
  poVar3 = std::operator<<(poVar3,", inner, I=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1a);
  std::operator<<(poVar3,"\n");
  fill_inner<128u,26u,buffer_layout_dfs>(std::array<Stream,128u>&,unsigned_char**,std::
  array<unsigned_long,128u>&,std::integral_constant<bool,true>)::DI::DI(std::__cxx11::string__
            (&need,(string *)__debug_indent_str_abi_cxx11_);
  local_48 = 0x5a9;
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x34)
    ;
    if (*pvVar4 == 0) {
      fill<128U,_52U,_buffer_layout_dfs>::operator()
                (&local_49,streams,buffer,(array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x34);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"left stream drained\n");
        goto LAB_002837cf;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x35)
    ;
    if (*pvVar4 == 0) {
      fill<128U,_53U,_buffer_layout_dfs>::operator()
                ((fill<128U,_53U,_buffer_layout_dfs> *)((long)&lcount + 3),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x35);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"right stream drained\n");
        goto LAB_00283a59;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x34)
    ;
    rcount = *pvVar4;
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x35)
    ;
    l = (uchar **)*pvVar4;
    r = buffer + (0x4413 - rcount);
    resultbuf = buffer + (0x4449 - (long)l);
    local_88 = buffer + (0x440b - local_48);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"L:\'");
    poVar3 = std::operator<<(poVar3,*r);
    poVar3 = std::operator<<(poVar3,"\', R:\'");
    poVar3 = std::operator<<(poVar3,*resultbuf);
    std::operator<<(poVar3,"\'\n");
    iVar2 = cmp(*r,*resultbuf);
    if (iVar2 < 1) {
      *local_88 = *r;
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x34);
      *pvVar4 = *pvVar4 - 1;
    }
    else {
      *local_88 = *resultbuf;
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x35);
      *pvVar4 = *pvVar4 - 1;
    }
    check_input(buffer + 0x3e62,0x5a9 - local_48);
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"Done, buffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x1a);
  *pvVar4 = 0x5a9;
  goto LAB_00283cc9;
LAB_002837cf:
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x35)
    ;
    if (*pvVar4 == 0) {
      fill<128U,_53U,_buffer_layout_dfs>::operator()
                ((fill<128U,_53U,_buffer_layout_dfs> *)((long)&begin + 3),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x35);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"both streams prematurely drained\n");
        newbegin = buffer + 0x3e62;
        rcount_1 = (size_t)(buffer + local_48 + 0x3e62);
        memmove((void *)rcount_1,newbegin,(0x5a9 - local_48) * 8);
        vVar5 = 0x5a9 - local_48;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,0x1a);
        from0 = rcount_1;
        *pvVar4 = vVar5;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,0x1a);
        check_input((uchar **)from0,*pvVar4);
        goto LAB_00283cc9;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x35)
    ;
    r_1 = (uchar **)*pvVar4;
    resultbuf_1 = buffer + (0x4449 - (long)r_1);
    local_b8 = buffer + (0x440b - local_48);
    *local_b8 = *resultbuf_1;
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x35)
    ;
    *pvVar4 = *pvVar4 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"\tbuffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x1a);
  *pvVar4 = 0x5a9;
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x1a);
  check_input(buffer + 0x3e62,*pvVar4);
  goto LAB_00283cc9;
LAB_00283a59:
  do {
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x34)
    ;
    if (*pvVar4 == 0) {
      fill<128U,_52U,_buffer_layout_dfs>::operator()
                ((fill<128U,_52U,_buffer_layout_dfs> *)((long)&begin_1 + 7),streams,buffer,
                 (array<unsigned_long,_128UL> *)__d.i);
      pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                         ((array<unsigned_long,_128UL> *)__d.i,0x34);
      if (*pvVar4 == 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
        std::operator<<(poVar3,"both streams prematurely drained\n");
        lVar1 = local_48 + 0x3e62;
        memmove(buffer + lVar1,buffer + 0x3e62,(0x5a9 - local_48) * 8);
        vVar5 = 0x5a9 - local_48;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,0x1a);
        *pvVar4 = vVar5;
        pvVar4 = std::array<unsigned_long,_128UL>::operator[]
                           ((array<unsigned_long,_128UL> *)__d.i,0x1a);
        check_input(buffer + lVar1,*pvVar4);
        goto LAB_00283cc9;
      }
    }
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x34)
    ;
    buffer[0x440b - local_48] = buffer[0x4413 - *pvVar4];
    pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x34)
    ;
    *pvVar4 = *pvVar4 - 1;
    local_48 = local_48 + -1;
  } while (local_48 != 0);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  std::operator<<(poVar3,"buffer filled\n");
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x1a);
  *pvVar4 = 0x5a9;
  pvVar4 = std::array<unsigned_long,_128UL>::operator[]((array<unsigned_long,_128UL> *)__d.i,0x1a);
  check_input(buffer + 0x3e62,*pvVar4);
LAB_00283cc9:
  begin._4_4_ = 1;
  anon_func::DI::~DI((DI *)&need);
  return;
}

Assistant:

void operator()(std::array<Stream,K>& restrict streams,
	                unsigned char** restrict buffer,
	                std::array<size_t,K>& restrict buffer_count) const
	{
		fill_inner<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>1 && I<K/2)>());
		fill_leaf<K,I,BufferLayout>(streams, buffer, buffer_count,
		    typename std::integral_constant<bool, (I>=K/2 && I<K)>());
	}